

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmSourceFile *source)

{
  pointer pcVar1;
  string *__k;
  const_iterator cVar2;
  string local_40;
  
  cmSourceFile::GetLanguage_abi_cxx11_(&local_40,source);
  if (local_40._M_string_length == 0) {
    __k = cmSourceFile::GetExtension_abi_cxx11_(source);
    if (__k->_M_string_length != 0) {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->OutputExtensions)._M_t,__k);
      if ((_Rb_tree_header *)cVar2._M_node !=
          &(this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (__k->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + __k->_M_string_length);
        goto LAB_002ac877;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    GetLanguageOutputExtension(__return_storage_ptr__,this,&local_40);
  }
LAB_002ac877:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    return this->GetLanguageOutputExtension(lang);
  }
  // if no language is found then check to see if it is already an
  // output extension for some language.  In that case it should be ignored
  // and in this map, so it will not be compiled but will just be used.
  std::string const& ext = source.GetExtension();
  if (!ext.empty()) {
    if (this->OutputExtensions.count(ext)) {
      return ext;
    }
  }
  return "";
}